

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_mwait_x86_64(CPUX86State *env,int next_eip_addend)

{
  int *piVar1;
  uintptr_t in_RAX;
  int iVar2;
  X86CPU *cpu;
  uintptr_t unaff_retaddr;
  
  if ((int)env->regs[1] != 0) {
    raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
  }
  iVar2 = 0x8b;
  cpu_svm_check_intercept_param_x86_64(env,0x8b,0,unaff_retaddr);
  env->eip = env->eip + (long)next_eip_addend;
  if (*(int *)((long)env[-1].hi16_zmm_regs + 0x3e0) != 0) {
    return;
  }
  cpu = (X86CPU *)(env[-6].mtrr_var + 4);
  do_hlt(cpu);
  cpu_svm_check_intercept_param_x86_64((CPUX86State *)cpu,0x77,0,in_RAX);
  piVar1 = &(cpu->parent_obj).jmp_env[0].__mask_was_saved;
  *(long *)piVar1 = *(long *)piVar1 + (long)iVar2;
  *(undefined4 *)&cpu[-1].env.wall_clock_msr = 0x10000;
  cpu_loop_exit_x86_64((CPUState *)(cpu[-1].parent_obj.tb_jmp_cache + 0x387));
}

Assistant:

void helper_mwait(CPUX86State *env, int next_eip_addend)
{
    CPUState *cs = env_cpu(env);
    X86CPU *cpu = env_archcpu(env);

    if ((uint32_t)env->regs[R_ECX] != 0) {
        raise_exception_ra(env, EXCP0D_GPF, GETPC());
    }

    cpu_svm_check_intercept_param(env, SVM_EXIT_MWAIT, 0, GETPC());
    env->eip += next_eip_addend;

    /* XXX: not complete but not completely erroneous */
    // if (cs->cpu_index != 0 || CPU_NEXT(cs) != NULL) { // TODO
    if (cs->cpu_index != 0) {
        // do_pause(cpu);
    } else {
        do_hlt(cpu);
    }
}